

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-platform-output.c
# Opt level: O2

int run_test_platform_output(void)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  undefined8 uStackY_730;
  uv_cpu_info_t *cpus;
  int count;
  uv_interface_address_t *interfaces;
  double uptime;
  size_t rss;
  uv_passwd_t pwd;
  size_t size;
  uv_rusage_t rusage;
  char buffer [512];
  uv_utsname_t uname;
  
  iVar1 = uv_get_process_title(buffer,0x200);
  if (iVar1 == 0) {
    printf("uv_get_process_title: %s\n",buffer);
    iVar1 = uv_cwd(buffer);
    if (iVar1 == 0) {
      printf("uv_cwd: %s\n",buffer);
      iVar1 = uv_resident_set_memory(&rss);
      if (iVar1 == 0) {
        printf("uv_resident_set_memory: %llu\n",rss);
        iVar1 = uv_uptime(&uptime);
        if (iVar1 == 0) {
          if (uptime <= 0.0) {
            pcVar3 = "uptime > 0";
            uStackY_730 = 0x41;
          }
          else {
            printf("uv_uptime: %f\n");
            iVar1 = uv_getrusage(&rusage);
            if (iVar1 == 0) {
              if (rusage.ru_utime.tv_sec < 0) {
                pcVar3 = "rusage.ru_utime.tv_sec >= 0";
                uStackY_730 = 0x47;
              }
              else if (rusage.ru_utime.tv_usec < 0) {
                pcVar3 = "rusage.ru_utime.tv_usec >= 0";
                uStackY_730 = 0x48;
              }
              else if (rusage.ru_stime.tv_sec < 0) {
                pcVar3 = "rusage.ru_stime.tv_sec >= 0";
                uStackY_730 = 0x49;
              }
              else if (rusage.ru_stime.tv_usec < 0) {
                pcVar3 = "rusage.ru_stime.tv_usec >= 0";
                uStackY_730 = 0x4a;
              }
              else {
                puts("uv_getrusage:");
                printf("  user: %llu sec %llu microsec\n",rusage.ru_utime.tv_sec,
                       rusage.ru_utime.tv_usec);
                printf("  system: %llu sec %llu microsec\n",rusage.ru_stime.tv_sec,
                       rusage.ru_stime.tv_usec);
                printf("  page faults: %llu\n",rusage.ru_majflt);
                printf("  maximum resident set size: %llu\n",rusage.ru_maxrss);
                iVar1 = uv_cpu_info(&cpus,&count);
                if (iVar1 == 0) {
                  puts("uv_cpu_info:");
                  lVar4 = 0;
                  for (lVar5 = 0; lVar5 < count; lVar5 = lVar5 + 1) {
                    printf("  model: %s\n",*(undefined8 *)((long)&cpus->model + lVar4));
                    printf("  speed: %d\n",(ulong)*(uint *)((long)&cpus->speed + lVar4));
                    printf("  times.sys: %llu\n",
                           *(undefined8 *)((long)&(cpus->cpu_times).sys + lVar4));
                    printf("  times.user: %llu\n",
                           *(undefined8 *)((long)&(cpus->cpu_times).user + lVar4));
                    printf("  times.idle: %llu\n",
                           *(undefined8 *)((long)&(cpus->cpu_times).idle + lVar4));
                    printf("  times.irq: %llu\n",
                           *(undefined8 *)((long)&(cpus->cpu_times).irq + lVar4));
                    printf("  times.nice: %llu\n",
                           *(undefined8 *)((long)&(cpus->cpu_times).nice + lVar4));
                    lVar4 = lVar4 + 0x38;
                  }
                  uv_free_cpu_info();
                  iVar1 = uv_interface_addresses(&interfaces,&count);
                  if (iVar1 == 0) {
                    puts("uv_interface_addresses:");
                    lVar4 = 0;
                    for (lVar5 = 0; lVar5 < count; lVar5 = lVar5 + 1) {
                      printf("  name: %s\n",*(undefined8 *)(interfaces->phys_addr + lVar4 + -8));
                      printf("  internal: %d\n",(ulong)*(uint *)(interfaces->phys_addr + lVar4 + 8))
                      ;
                      printf("  physical address: ");
                      printf("%02x:%02x:%02x:%02x:%02x:%02x\n",
                             (ulong)(byte)interfaces->phys_addr[lVar4],
                             (ulong)(byte)interfaces->phys_addr[lVar4 + 1],
                             (ulong)(byte)interfaces->phys_addr[lVar4 + 2],
                             (ulong)(byte)interfaces->phys_addr[lVar4 + 3],
                             (ulong)(byte)interfaces->phys_addr[lVar4 + 4],
                             (uint)(byte)interfaces->phys_addr[lVar4 + 5]);
                      pcVar3 = interfaces->phys_addr + lVar4 + 0xc;
                      if (*(short *)pcVar3 == 10) {
                        uv_ip6_name(pcVar3,buffer,0x200);
                      }
                      else if (*(short *)pcVar3 == 2) {
                        uv_ip4_name(pcVar3,buffer,0x200);
                      }
                      printf("  address: %s\n",buffer);
                      pcVar3 = interfaces->phys_addr + lVar4 + 0x28;
                      if (*(short *)pcVar3 == 10) {
                        uv_ip6_name(pcVar3,buffer,0x200);
LAB_0014264e:
                        printf("  netmask: %s\n",buffer);
                      }
                      else {
                        if (*(short *)pcVar3 == 2) {
                          uv_ip4_name(pcVar3,buffer,0x200);
                          goto LAB_0014264e;
                        }
                        puts("  netmask: none");
                      }
                      lVar4 = lVar4 + 0x50;
                    }
                    uv_free_interface_addresses();
                    iVar1 = uv_os_get_passwd(&pwd);
                    if (iVar1 == 0) {
                      puts("uv_os_get_passwd:");
                      printf("  euid: %ld\n",pwd.uid);
                      printf("  gid: %ld\n",pwd.gid);
                      printf("  username: %s\n",pwd.username);
                      printf("  shell: %s\n",pwd.shell);
                      printf("  home directory: %s\n",pwd.homedir);
                      uVar2 = uv_os_getpid();
                      if ((int)uVar2 < 1) {
                        pcVar3 = "pid > 0";
                        uStackY_730 = 0x9b;
                      }
                      else {
                        printf("uv_os_getpid: %d\n",(ulong)uVar2);
                        uVar2 = uv_os_getppid();
                        if ((int)uVar2 < 1) {
                          pcVar3 = "ppid > 0";
                          uStackY_730 = 0x9e;
                        }
                        else {
                          printf("uv_os_getppid: %d\n",(ulong)uVar2);
                          iVar1 = uv_os_uname(&uname);
                          if (iVar1 == 0) {
                            puts("uv_os_uname:");
                            printf("  sysname: %s\n",&uname);
                            printf("  release: %s\n",uname.release);
                            printf("  version: %s\n",uname.version);
                            printf("  machine: %s\n",uname.machine);
                            return 0;
                          }
                          pcVar3 = "err == 0";
                          uStackY_730 = 0xa2;
                        }
                      }
                    }
                    else {
                      pcVar3 = "err == 0";
                      uStackY_730 = 0x91;
                    }
                  }
                  else {
                    pcVar3 = "err == 0";
                    uStackY_730 = 0x6d;
                  }
                }
                else {
                  pcVar3 = "err == 0";
                  uStackY_730 = 0x5a;
                }
              }
            }
            else {
              pcVar3 = "err == 0";
              uStackY_730 = 0x46;
            }
          }
        }
        else {
          pcVar3 = "err == 0";
          uStackY_730 = 0x40;
        }
      }
      else {
        pcVar3 = "err == 0";
        uStackY_730 = 0x38;
      }
    }
    else {
      pcVar3 = "err == 0";
      uStackY_730 = 0x31;
    }
  }
  else {
    pcVar3 = "err == 0";
    uStackY_730 = 0x2c;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-platform-output.c"
          ,uStackY_730,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(platform_output) {
  char buffer[512];
  size_t rss;
  size_t size;
  double uptime;
  uv_pid_t pid;
  uv_pid_t ppid;
  uv_rusage_t rusage;
  uv_cpu_info_t* cpus;
  uv_interface_address_t* interfaces;
  uv_passwd_t pwd;
  uv_utsname_t uname;
  int count;
  int i;
  int err;

  err = uv_get_process_title(buffer, sizeof(buffer));
  ASSERT(err == 0);
  printf("uv_get_process_title: %s\n", buffer);

  size = sizeof(buffer);
  err = uv_cwd(buffer, &size);
  ASSERT(err == 0);
  printf("uv_cwd: %s\n", buffer);

  err = uv_resident_set_memory(&rss);
#if defined(__MSYS__)
  ASSERT(err == UV_ENOSYS);
#else
  ASSERT(err == 0);
  printf("uv_resident_set_memory: %llu\n", (unsigned long long) rss);
#endif

  err = uv_uptime(&uptime);
#if defined(__PASE__)
  ASSERT(err == UV_ENOSYS);
#else
  ASSERT(err == 0);
  ASSERT(uptime > 0);
  printf("uv_uptime: %f\n", uptime);
#endif

  err = uv_getrusage(&rusage);
  ASSERT(err == 0);
  ASSERT(rusage.ru_utime.tv_sec >= 0);
  ASSERT(rusage.ru_utime.tv_usec >= 0);
  ASSERT(rusage.ru_stime.tv_sec >= 0);
  ASSERT(rusage.ru_stime.tv_usec >= 0);
  printf("uv_getrusage:\n");
  printf("  user: %llu sec %llu microsec\n",
         (unsigned long long) rusage.ru_utime.tv_sec,
         (unsigned long long) rusage.ru_utime.tv_usec);
  printf("  system: %llu sec %llu microsec\n",
         (unsigned long long) rusage.ru_stime.tv_sec,
         (unsigned long long) rusage.ru_stime.tv_usec);
  printf("  page faults: %llu\n", (unsigned long long) rusage.ru_majflt);
  printf("  maximum resident set size: %llu\n",
         (unsigned long long) rusage.ru_maxrss);

  err = uv_cpu_info(&cpus, &count);
#if defined(__CYGWIN__) || defined(__MSYS__)
  ASSERT(err == UV_ENOSYS);
#else
  ASSERT(err == 0);

  printf("uv_cpu_info:\n");
  for (i = 0; i < count; i++) {
    printf("  model: %s\n", cpus[i].model);
    printf("  speed: %d\n", cpus[i].speed);
    printf("  times.sys: %llu\n", (unsigned long long) cpus[i].cpu_times.sys);
    printf("  times.user: %llu\n",
           (unsigned long long) cpus[i].cpu_times.user);
    printf("  times.idle: %llu\n",
           (unsigned long long) cpus[i].cpu_times.idle);
    printf("  times.irq: %llu\n",  (unsigned long long) cpus[i].cpu_times.irq);
    printf("  times.nice: %llu\n",
           (unsigned long long) cpus[i].cpu_times.nice);
  }
#endif
  uv_free_cpu_info(cpus, count);

  err = uv_interface_addresses(&interfaces, &count);
  ASSERT(err == 0);

  printf("uv_interface_addresses:\n");
  for (i = 0; i < count; i++) {
    printf("  name: %s\n", interfaces[i].name);
    printf("  internal: %d\n", interfaces[i].is_internal);
    printf("  physical address: ");
    printf("%02x:%02x:%02x:%02x:%02x:%02x\n",
           (unsigned char)interfaces[i].phys_addr[0],
           (unsigned char)interfaces[i].phys_addr[1],
           (unsigned char)interfaces[i].phys_addr[2],
           (unsigned char)interfaces[i].phys_addr[3],
           (unsigned char)interfaces[i].phys_addr[4],
           (unsigned char)interfaces[i].phys_addr[5]);

    if (interfaces[i].address.address4.sin_family == AF_INET) {
      uv_ip4_name(&interfaces[i].address.address4, buffer, sizeof(buffer));
    } else if (interfaces[i].address.address4.sin_family == AF_INET6) {
      uv_ip6_name(&interfaces[i].address.address6, buffer, sizeof(buffer));
    }

    printf("  address: %s\n", buffer);

    if (interfaces[i].netmask.netmask4.sin_family == AF_INET) {
      uv_ip4_name(&interfaces[i].netmask.netmask4, buffer, sizeof(buffer));
      printf("  netmask: %s\n", buffer);
    } else if (interfaces[i].netmask.netmask4.sin_family == AF_INET6) {
      uv_ip6_name(&interfaces[i].netmask.netmask6, buffer, sizeof(buffer));
      printf("  netmask: %s\n", buffer);
    } else {
      printf("  netmask: none\n");
    }
  }
  uv_free_interface_addresses(interfaces, count);

  err = uv_os_get_passwd(&pwd);
  ASSERT(err == 0);

  printf("uv_os_get_passwd:\n");
  printf("  euid: %ld\n", pwd.uid);
  printf("  gid: %ld\n", pwd.gid);
  printf("  username: %s\n", pwd.username);
  printf("  shell: %s\n", pwd.shell);
  printf("  home directory: %s\n", pwd.homedir);

  pid = uv_os_getpid();
  ASSERT(pid > 0);
  printf("uv_os_getpid: %d\n", (int) pid);
  ppid = uv_os_getppid();
  ASSERT(ppid > 0);
  printf("uv_os_getppid: %d\n", (int) ppid);

  err = uv_os_uname(&uname);
  ASSERT(err == 0);
  printf("uv_os_uname:\n");
  printf("  sysname: %s\n", uname.sysname);
  printf("  release: %s\n", uname.release);
  printf("  version: %s\n", uname.version);
  printf("  machine: %s\n", uname.machine);

  return 0;
}